

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall SimpleString::deallocateInternalBuffer(SimpleString *this)

{
  SimpleString *this_local;
  
  if (this->buffer_ != (char *)0x0) {
    deallocStringBuffer(this->buffer_,this->bufferSize_,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleString.cpp"
                        ,0xee);
    this->buffer_ = (char *)0x0;
    this->bufferSize_ = 0;
  }
  return;
}

Assistant:

void SimpleString::deallocateInternalBuffer()
{
    if (buffer_) {
        deallocStringBuffer(buffer_, bufferSize_, __FILE__, __LINE__);
        buffer_ = NULLPTR;
        bufferSize_ = 0;
    }
}